

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O2

void __thiscall wasm::FunctionValidator::visitSIMDTernary(FunctionValidator *this,SIMDTernary *curr)

{
  shouldBeTrue<wasm::SIMDTernary*>
            (this,SUB41(((((this->
                           super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                           ).
                           super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                           .
                           super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                          .currModule)->features).features & 8) >> 3,0),curr,
             "SIMD operations require SIMD [--enable-simd]");
  shouldBeEqualOrFirstIsUnreachable<wasm::SIMDTernary*,wasm::Type>
            (this,(Type)(curr->super_SpecificExpression<(wasm::Expression::Id)32>).super_Expression.
                        type.id,(Type)0x6,curr,"SIMD ternary must have type v128");
  shouldBeEqualOrFirstIsUnreachable<wasm::SIMDTernary*,wasm::Type>
            (this,(Type)(curr->a->type).id,(Type)0x6,curr,"expected operand of type v128");
  shouldBeEqualOrFirstIsUnreachable<wasm::SIMDTernary*,wasm::Type>
            (this,(Type)(curr->b->type).id,(Type)0x6,curr,"expected operand of type v128");
  shouldBeEqualOrFirstIsUnreachable<wasm::SIMDTernary*,wasm::Type>
            (this,(Type)(curr->c->type).id,(Type)0x6,curr,"expected operand of type v128");
  return;
}

Assistant:

void FunctionValidator::visitSIMDTernary(SIMDTernary* curr) {
  shouldBeTrue(getModule()->features.hasSIMD(),
               curr,
               "SIMD operations require SIMD [--enable-simd]");
  shouldBeEqualOrFirstIsUnreachable(
    curr->type, Type(Type::v128), curr, "SIMD ternary must have type v128");
  shouldBeEqualOrFirstIsUnreachable(
    curr->a->type, Type(Type::v128), curr, "expected operand of type v128");
  shouldBeEqualOrFirstIsUnreachable(
    curr->b->type, Type(Type::v128), curr, "expected operand of type v128");
  shouldBeEqualOrFirstIsUnreachable(
    curr->c->type, Type(Type::v128), curr, "expected operand of type v128");
}